

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O2

vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *
computeIntersections
          (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
           *__return_storage_ptr__,vector<Node,_std::allocator<Node>_> *nodes,
          vector<bool,_std::allocator<bool>_> *removed)

{
  pointer pNVar1;
  const_reference cVar2;
  bool bVar3;
  size_t i;
  ulong __n;
  size_t j;
  size_type __n_00;
  long lVar4;
  pointer local_50;
  Node *local_48;
  vector<Node,_std::allocator<Node>_> *local_40;
  vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = 0;
  local_40 = nodes;
  local_38 = (vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>> *)
             __return_storage_ptr__;
  do {
    if ((ulong)(((long)(local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x18) <= __n) {
      return (vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             local_38;
    }
    if (((long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p) * 8 +
        (ulong)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
LAB_001014dc:
      lVar4 = 0;
      for (__n_00 = 0; __n != __n_00; __n_00 = __n_00 + 1) {
        if (((long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
            (ulong)(removed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
LAB_0010150e:
          pNVar1 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar3 = quadtree::Box<float>::intersects
                            (&pNVar1[__n].box,(Box<float> *)((long)&(pNVar1->box).left + lVar4));
          if (bVar3) {
            pNVar1 = (local_40->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_50 = pNVar1 + __n;
            local_48 = (Node *)((long)&(pNVar1->box).left + lVar4);
            std::vector<std::pair<Node*,Node*>,std::allocator<std::pair<Node*,Node*>>>::
            emplace_back<Node*,Node*>(local_38,&local_50,&local_48);
          }
        }
        else {
          cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](removed,__n_00);
          if (!cVar2) goto LAB_0010150e;
        }
        lVar4 = lVar4 + 0x18;
      }
    }
    else {
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](removed,__n);
      if (!cVar2) goto LAB_001014dc;
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

std::vector<std::pair<Node*, Node*>> computeIntersections(std::vector<Node>& nodes, const std::vector<bool>& removed)
{
    auto intersections = std::vector<std::pair<Node*, Node*>>();
    for (auto i = std::size_t(0); i < nodes.size(); ++i)
    {
        if (removed.size() == 0 || !removed[i])
        {
            for (auto j = std::size_t(0); j < i; ++j)
            {
                if (removed.size() == 0 || !removed[j])
                {
                    if (nodes[i].box.intersects(nodes[j].box))
                        intersections.emplace_back(&nodes[i], &nodes[j]);
                }
            }
        }
    }
    return intersections;
}